

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
diligent_spirv_cross::Compiler::CombinedImageSamplerHandler::end_function_scope
          (CombinedImageSamplerHandler *this,uint32_t *args,uint32_t length)

{
  SPIRFunction *caller;
  SPIRFunction *pSVar1;
  _Elt_pointer ppSVar2;
  long lVar3;
  VariableID *pVVar4;
  SPIRVariable *pSVar5;
  SPIRVariable *pSVar6;
  VariableID *pVVar7;
  VariableID image_id;
  VariableID sampler_id;
  CombinedImageSamplerParameter *param;
  CombinedImageSamplerParameter *pCVar8;
  VariableID *pVVar9;
  
  if (2 < length) {
    pSVar1 = get<diligent_spirv_cross::SPIRFunction>(this->compiler,args[2]);
    ::std::
    deque<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_std::allocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
    ::pop_back(&(this->parameter_remapping).c);
    pSVar1->do_combined_parameters = false;
    ppSVar2 = (this->functions).c.
              super__Deque_base<diligent_spirv_cross::SPIRFunction_*,_std::allocator<diligent_spirv_cross::SPIRFunction_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppSVar2 ==
        (this->functions).c.
        super__Deque_base<diligent_spirv_cross::SPIRFunction_*,_std::allocator<diligent_spirv_cross::SPIRFunction_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppSVar2 = (this->functions).c.
                super__Deque_base<diligent_spirv_cross::SPIRFunction_*,_std::allocator<diligent_spirv_cross::SPIRFunction_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pSVar1 = ppSVar2[-1];
    ::std::
    deque<diligent_spirv_cross::SPIRFunction_*,_std::allocator<diligent_spirv_cross::SPIRFunction_*>_>
    ::pop_back(&(this->functions).c);
    ppSVar2 = (this->functions).c.
              super__Deque_base<diligent_spirv_cross::SPIRFunction_*,_std::allocator<diligent_spirv_cross::SPIRFunction_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppSVar2 !=
        (this->functions).c.
        super__Deque_base<diligent_spirv_cross::SPIRFunction_*,_std::allocator<diligent_spirv_cross::SPIRFunction_*>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      if (ppSVar2 ==
          (this->functions).c.
          super__Deque_base<diligent_spirv_cross::SPIRFunction_*,_std::allocator<diligent_spirv_cross::SPIRFunction_*>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppSVar2 = (this->functions).c.
                  super__Deque_base<diligent_spirv_cross::SPIRFunction_*,_std::allocator<diligent_spirv_cross::SPIRFunction_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      caller = ppSVar2[-1];
      if (caller->do_combined_parameters == true) {
        pCVar8 = (pSVar1->combined_parameters).
                 super_VectorView<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter>
                 .ptr;
        pVVar9 = &pCVar8->sampler_id;
        for (lVar3 = (pSVar1->combined_parameters).
                     super_VectorView<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter>
                     .buffer_size << 4; lVar3 != 0; lVar3 = lVar3 + -0x10) {
          pVVar4 = pVVar9 + -1;
          if (pCVar8->global_image == false) {
            pVVar4 = (VariableID *)(args + (ulong)pVVar4->id + 3);
          }
          pVVar7 = pVVar9;
          if (pCVar8->global_sampler == false) {
            pVVar7 = (VariableID *)(args + (ulong)pVVar9->id + 3);
          }
          image_id.id = pVVar4->id;
          sampler_id.id = pVVar7->id;
          pSVar5 = maybe_get_backing_variable(this->compiler,image_id.id);
          pSVar6 = maybe_get_backing_variable(this->compiler,sampler_id.id);
          if (pSVar5 != (SPIRVariable *)0x0) {
            image_id.id = (pSVar5->super_IVariant).self.id;
          }
          if (pSVar6 != (SPIRVariable *)0x0) {
            sampler_id.id = (pSVar6->super_IVariant).self.id;
          }
          register_combined_image_sampler
                    (this,caller,(VariableID)0x0,image_id,sampler_id,pCVar8->depth);
          pCVar8 = pCVar8 + 1;
          pVVar9 = pVVar9 + 4;
        }
      }
    }
  }
  return 2 < length;
}

Assistant:

bool Compiler::CombinedImageSamplerHandler::end_function_scope(const uint32_t *args, uint32_t length)
{
	if (length < 3)
		return false;

	auto &callee = compiler.get<SPIRFunction>(args[2]);
	args += 3;

	// There are two types of cases we have to handle,
	// a callee might call sampler2D(texture2D, sampler) directly where
	// one or more parameters originate from parameters.
	// Alternatively, we need to provide combined image samplers to our callees,
	// and in this case we need to add those as well.

	pop_remap_parameters();

	// Our callee has now been processed at least once.
	// No point in doing it again.
	callee.do_combined_parameters = false;

	auto &params = functions.top()->combined_parameters;
	functions.pop();
	if (functions.empty())
		return true;

	auto &caller = *functions.top();
	if (caller.do_combined_parameters)
	{
		for (auto &param : params)
		{
			VariableID image_id = param.global_image ? param.image_id : VariableID(args[param.image_id]);
			VariableID sampler_id = param.global_sampler ? param.sampler_id : VariableID(args[param.sampler_id]);

			auto *i = compiler.maybe_get_backing_variable(image_id);
			auto *s = compiler.maybe_get_backing_variable(sampler_id);
			if (i)
				image_id = i->self;
			if (s)
				sampler_id = s->self;

			register_combined_image_sampler(caller, 0, image_id, sampler_id, param.depth);
		}
	}

	return true;
}